

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmcmd.cxx
# Opt level: O1

int cmcmd::SymlinkLibrary
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args)

{
  pointer pbVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  string soName;
  string name;
  string realName;
  string local_80;
  string local_60;
  string local_40;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[2]._M_dataplus._M_p;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar2,pcVar2 + pbVar1[2]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[3]._M_dataplus._M_p;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_80,pcVar2,pcVar2 + pbVar1[3]._M_string_length);
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pcVar2 = pbVar1[4]._M_dataplus._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + pbVar1[4]._M_string_length);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_40);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_80);
  cmsys::SystemTools::ConvertToUnixSlashes(&local_60);
  if (local_80._M_string_length == local_40._M_string_length) {
    iVar5 = 0;
    if (local_80._M_string_length != 0) {
      iVar4 = bcmp(local_80._M_dataplus._M_p,local_40._M_dataplus._M_p,local_80._M_string_length);
      if (iVar4 != 0) goto LAB_0014da50;
    }
  }
  else {
LAB_0014da50:
    bVar3 = SymlinkInternal(&local_40,&local_80);
    iVar5 = 0;
    if (!bVar3) {
      iVar5 = 1;
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
    }
  }
  if (local_60._M_string_length == local_80._M_string_length) {
    if (local_60._M_string_length == 0) goto LAB_0014dabe;
    iVar4 = bcmp(local_60._M_dataplus._M_p,local_80._M_dataplus._M_p,local_60._M_string_length);
    if (iVar4 == 0) goto LAB_0014dabe;
  }
  bVar3 = SymlinkInternal(&local_80,&local_60);
  if (!bVar3) {
    iVar5 = 1;
    cmSystemTools::ReportLastSystemError("cmake_symlink_library");
  }
LAB_0014dabe:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return iVar5;
}

Assistant:

int cmcmd::SymlinkLibrary(std::vector<std::string> const& args)
{
  int result = 0;
  std::string realName = args[2];
  std::string soName = args[3];
  std::string name = args[4];
  cmSystemTools::ConvertToUnixSlashes(realName);
  cmSystemTools::ConvertToUnixSlashes(soName);
  cmSystemTools::ConvertToUnixSlashes(name);
  if (soName != realName) {
    if (!cmcmd::SymlinkInternal(realName, soName)) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
    }
  }
  if (name != soName) {
    if (!cmcmd::SymlinkInternal(soName, name)) {
      cmSystemTools::ReportLastSystemError("cmake_symlink_library");
      result = 1;
    }
  }
  return result;
}